

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O3

size_t google::protobuf::internal::WireFormat::FieldDataOnlyByteSize
                 (FieldDescriptor *field,Message *message)

{
  byte bVar1;
  FieldDescriptor *field_00;
  FieldDescriptor *pFVar2;
  size_type sVar3;
  long lVar4;
  bool bVar5;
  uint uVar6;
  CppStringType CVar7;
  int32_t iVar8;
  uint32_t uVar9;
  int iVar10;
  MapFieldBase *this;
  Descriptor *pDVar11;
  size_t sVar12;
  size_t sVar13;
  undefined4 extraout_var;
  EnumValueDescriptor *pEVar14;
  uint64_t uVar15;
  int64_t iVar16;
  ulong uVar17;
  Message *pMVar18;
  undefined4 extraout_var_00;
  string *psVar19;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ExtensionSet *this_00;
  Nonnull<const_char_*> failure_msg;
  undefined8 extraout_RAX;
  Reflection *this_01;
  size_t sVar20;
  Metadata MVar21;
  MapIterator iter;
  MapIterator end;
  anon_union_16_2_39e9c77e_for_Rep_0 local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  MapKey local_b8;
  MapValueConstRef local_a0;
  Reflection *local_90;
  MapIterator local_78;
  
  MVar21 = Message::GetMetadata(message);
  this_01 = MVar21.reflection;
  if ((field->type_ == '\v') && (bVar5 = FieldDescriptor::is_map_message_type(field), bVar5)) {
    this = Reflection::GetMapData(this_01,message,field);
    bVar5 = MapFieldBase::IsMapValid(this);
    if (!bVar5) goto LAB_00fdde27;
    MapIterator::MapIterator((MapIterator *)&local_d8.as_tree,message,field);
    MapIterator::MapIterator(&local_78,message,field);
    pDVar11 = FieldDescriptor::message_type(field);
    if (pDVar11->field_count_ < 1) goto LAB_00fde4e0;
    field_00 = pDVar11->fields_;
    pDVar11 = FieldDescriptor::message_type(field);
    if (1 < pDVar11->field_count_) {
      pFVar2 = pDVar11->fields_;
      MapFieldBase::MapBegin(this,(MapIterator *)&local_d8.as_tree);
      MapFieldBase::MapEnd(this,&local_78);
      bVar5 = MapFieldBase::EqualIterator
                        ((MapFieldBase *)local_c8._8_8_,(MapIterator *)&local_d8.as_tree,&local_78);
      sVar20 = 0;
      if (!bVar5) {
        do {
          sVar12 = MapKeyDataOnlyByteSize(field_00,&local_b8);
          sVar13 = MapValueRefDataOnlyByteSize((FieldDescriptor *)(ulong)pFVar2[1].type_,&local_a0);
          uVar6 = (int)sVar13 + (int)sVar12 + 2U | 1;
          iVar10 = 0x1f;
          if (uVar6 != 0) {
            for (; uVar6 >> iVar10 == 0; iVar10 = iVar10 + -1) {
            }
          }
          sVar20 = sVar20 + sVar12 + sVar13 + 2 + (ulong)(iVar10 * 9 + 0x49U >> 6);
          MapFieldBase::IncreaseIterator
                    ((MapFieldBase *)local_c8._8_8_,(MapIterator *)&local_d8.as_tree);
          bVar5 = MapFieldBase::EqualIterator
                            ((MapFieldBase *)local_c8._8_8_,(MapIterator *)&local_d8.as_tree,
                             &local_78);
        } while (!bVar5);
        return sVar20;
      }
      return 0;
    }
LAB_00fde4ea:
    FieldDataOnlyByteSize();
LAB_00fde4f4:
    FieldDataOnlyByteSize();
LAB_00fde507:
    FieldDataOnlyByteSize();
LAB_00fde51a:
    FieldDataOnlyByteSize();
LAB_00fde52d:
    FieldDataOnlyByteSize();
LAB_00fde540:
    FieldDataOnlyByteSize();
LAB_00fde553:
    FieldDataOnlyByteSize();
LAB_00fde566:
    FieldDataOnlyByteSize();
LAB_00fde579:
    FieldDataOnlyByteSize();
LAB_00fde58c:
    FieldDataOnlyByteSize();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8.as_tree.cordz_info != &local_c8) {
      operator_delete((void *)local_d8.as_tree.cordz_info,
                      CONCAT71(local_c8._M_allocated_capacity._1_7_,local_c8._M_local_buf[0]) + 1);
    }
    _Unwind_Resume(extraout_RAX);
  }
LAB_00fdde27:
  bVar1 = field->field_0x1;
  if (0xbf < bVar1 != (bool)((bVar1 & 0x20) >> 5)) {
    FieldDataOnlyByteSize();
LAB_00fde4e0:
    FieldDataOnlyByteSize();
    goto LAB_00fde4ea;
  }
  if ((bVar1 & 0x20) == 0) {
    sVar20 = 1;
    if ((field->containing_type_->options_->field_0)._impl_.map_entry_ == false) {
      bVar5 = Reflection::HasField(this_01,message,field);
      sVar20 = (size_t)bVar5;
    }
  }
  else {
    uVar6 = Reflection::FieldSize(this_01,message,field);
    sVar20 = (size_t)uVar6;
  }
  switch(field->type_) {
  case '\x01':
  case '\x06':
  case '\x10':
    sVar20 = sVar20 << 3;
    break;
  case '\x02':
  case '\a':
  case '\x0f':
    sVar20 = sVar20 << 2;
    break;
  case '\x03':
    bVar1 = field->field_0x1;
    if (0xbf < bVar1 == (bool)((bVar1 & 0x20) >> 5)) {
      if ((bVar1 & 0x20) != 0) {
        if (sVar20 == 0) {
          return 0;
        }
        sVar13 = 0;
        sVar12 = 0;
        do {
          uVar17 = Reflection::GetRepeatedInt64(this_01,message,field,(int)sVar13);
          lVar4 = 0x3f;
          if ((uVar17 | 1) != 0) {
            for (; (uVar17 | 1) >> lVar4 == 0; lVar4 = lVar4 + -1) {
            }
          }
          sVar12 = sVar12 + ((int)lVar4 * 9 + 0x49U >> 6);
          sVar13 = sVar13 + 1;
        } while (sVar20 != sVar13);
        return sVar12;
      }
      uVar17 = Reflection::GetInt64(this_01,message,field);
LAB_00fde422:
      uVar17 = uVar17 | 1;
LAB_00fde426:
      lVar4 = 0x3f;
      if (uVar17 != 0) {
        for (; uVar17 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      iVar10 = (int)lVar4;
LAB_00fde42a:
      return (ulong)(iVar10 * 9 + 0x49U >> 6);
    }
    goto LAB_00fde553;
  case '\x04':
    bVar1 = field->field_0x1;
    if (0xbf < bVar1 == (bool)((bVar1 & 0x20) >> 5)) {
      if ((bVar1 & 0x20) != 0) {
        if (sVar20 == 0) {
          return 0;
        }
        sVar13 = 0;
        sVar12 = 0;
        do {
          uVar15 = Reflection::GetRepeatedUInt64(this_01,message,field,(int)sVar13);
          lVar4 = 0x3f;
          if ((uVar15 | 1) != 0) {
            for (; (uVar15 | 1) >> lVar4 == 0; lVar4 = lVar4 + -1) {
            }
          }
          sVar12 = sVar12 + ((int)lVar4 * 9 + 0x49U >> 6);
          sVar13 = sVar13 + 1;
        } while (sVar20 != sVar13);
        return sVar12;
      }
      uVar17 = Reflection::GetUInt64(this_01,message,field);
      goto LAB_00fde422;
    }
    goto LAB_00fde566;
  case '\x05':
    bVar1 = field->field_0x1;
    if (0xbf < bVar1 == (bool)((bVar1 & 0x20) >> 5)) {
      if ((bVar1 & 0x20) != 0) {
        if (sVar20 == 0) {
          return 0;
        }
        sVar13 = 0;
        sVar12 = 0;
        do {
          uVar6 = Reflection::GetRepeatedInt32(this_01,message,field,(int)sVar13);
          lVar4 = 0x3f;
          if ((long)(int)(uVar6 | 1) != 0) {
            for (; (ulong)(long)(int)(uVar6 | 1) >> lVar4 == 0; lVar4 = lVar4 + -1) {
            }
          }
          sVar12 = sVar12 + ((int)lVar4 * 9 + 0x49U >> 6);
          sVar13 = sVar13 + 1;
        } while (sVar20 != sVar13);
        return sVar12;
      }
      uVar6 = Reflection::GetInt32(this_01,message,field);
      uVar17 = (ulong)(int)(uVar6 | 1);
      goto LAB_00fde426;
    }
    goto LAB_00fde52d;
  case '\b':
    break;
  case '\t':
  case '\f':
    CVar7 = FieldDescriptor::cpp_string_type(field);
    if (CVar7 != kCord) {
      if (sVar20 == 0) {
        return 0;
      }
      sVar13 = 0;
      sVar12 = 0;
      local_90 = this_01;
      do {
        local_d8.as_tree.cordz_info = (cordz_info_t)&local_c8;
        local_d8.as_tree.rep = (CordRep *)0x0;
        local_c8._M_local_buf[0] = '\0';
        bVar1 = field->field_0x1;
        bVar5 = (bool)((bVar1 & 0x20) >> 5);
        if (0xbf < bVar1 != bVar5) {
          failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                  (bVar5,0xbf < bVar1,
                                   "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_78,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xb54,failure_msg);
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_78);
        }
        if ((bVar1 & 0x20) == 0) {
          psVar19 = Reflection::GetStringReference
                              (local_90,message,field,(string *)&local_d8.as_tree);
        }
        else {
          psVar19 = Reflection::GetRepeatedStringReference
                              (local_90,message,field,(int)sVar13,(string *)&local_d8.as_tree);
        }
        sVar3 = psVar19->_M_string_length;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8.as_tree.cordz_info != &local_c8) {
          operator_delete((void *)local_d8.as_tree.cordz_info,
                          CONCAT71(local_c8._M_allocated_capacity._1_7_,local_c8._M_local_buf[0]) +
                          1);
        }
        uVar6 = (uint)sVar3 | 1;
        iVar10 = 0x1f;
        if (uVar6 != 0) {
          for (; uVar6 >> iVar10 == 0; iVar10 = iVar10 + -1) {
          }
        }
        sVar12 = sVar12 + sVar3 + (ulong)(iVar10 * 9 + 0x49U >> 6);
        sVar13 = sVar13 + 1;
      } while (sVar20 != sVar13);
      return sVar12;
    }
    if (sVar20 == 0) {
      return 0;
    }
    sVar12 = 0;
    do {
      Reflection::GetCord((Reflection *)&local_d8.as_tree,(Message *)this_01,
                          (FieldDescriptor *)message);
      if (((long)local_d8.data[0] & 1U) == 0) {
        uVar17 = (ulong)(long)local_d8.data[0] >> 1;
      }
      else {
        uVar17 = (local_d8.as_tree.rep)->length;
      }
      uVar6 = (uint)uVar17 | 1;
      iVar10 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> iVar10 == 0; iVar10 = iVar10 + -1) {
        }
      }
      sVar12 = sVar12 + uVar17 + (ulong)(iVar10 * 9 + 0x49U >> 6);
      absl::lts_20250127::Cord::~Cord((Cord *)&local_d8.as_tree);
      sVar20 = sVar20 - 1;
    } while (sVar20 != 0);
    return sVar12;
  case '\n':
    bVar1 = field->field_0x1;
    if (0xbf < bVar1 == (bool)((bVar1 & 0x20) >> 5)) {
      if ((bVar1 & 0x20) == 0) {
        pMVar18 = Reflection::GetMessage(this_01,message,field,(MessageFactory *)0x0);
        iVar10 = (*(pMVar18->super_MessageLite)._vptr_MessageLite[3])(pMVar18);
        return CONCAT44(extraout_var_01,iVar10);
      }
      if (sVar20 == 0) {
        return 0;
      }
      sVar13 = 0;
      sVar12 = 0;
      do {
        pMVar18 = Reflection::GetRepeatedMessage(this_01,message,field,(int)sVar13);
        iVar10 = (*(pMVar18->super_MessageLite)._vptr_MessageLite[3])(pMVar18);
        sVar12 = sVar12 + CONCAT44(extraout_var,iVar10);
        sVar13 = sVar13 + 1;
      } while (sVar20 != sVar13);
      return sVar12;
    }
    goto LAB_00fde51a;
  case '\v':
    bVar1 = field->field_0x1;
    if (0xbf < bVar1 == (bool)((bVar1 & 0x20) >> 5)) {
      if ((bVar1 & 0x20) == 0) {
        if ((bVar1 & 8) == 0) {
          pMVar18 = Reflection::GetMessage(this_01,message,field,(MessageFactory *)0x0);
          iVar10 = (*(pMVar18->super_MessageLite)._vptr_MessageLite[3])(pMVar18);
          sVar20 = CONCAT44(extraout_var_02,iVar10);
        }
        else {
          this_00 = Reflection::GetExtensionSet(this_01,message);
          sVar20 = ExtensionSet::GetMessageByteSizeLong(this_00,field->number_);
        }
        uVar6 = (uint)sVar20 | 1;
        iVar10 = 0x1f;
        if (uVar6 != 0) {
          for (; uVar6 >> iVar10 == 0; iVar10 = iVar10 + -1) {
          }
        }
        return (iVar10 * 9 + 0x49U >> 6) + sVar20;
      }
      if (sVar20 == 0) {
        return 0;
      }
      sVar13 = 0;
      sVar12 = 0;
      do {
        pMVar18 = Reflection::GetRepeatedMessage(this_01,message,field,(int)sVar13);
        uVar6 = (*(pMVar18->super_MessageLite)._vptr_MessageLite[3])(pMVar18);
        iVar10 = 0x1f;
        if ((uVar6 | 1) != 0) {
          for (; (uVar6 | 1) >> iVar10 == 0; iVar10 = iVar10 + -1) {
          }
        }
        sVar12 = sVar12 + CONCAT44(extraout_var_00,uVar6) + (ulong)(iVar10 * 9 + 0x49U >> 6);
        sVar13 = sVar13 + 1;
      } while (sVar20 != sVar13);
      return sVar12;
    }
    goto LAB_00fde58c;
  case '\r':
    bVar1 = field->field_0x1;
    if (0xbf < bVar1 == (bool)((bVar1 & 0x20) >> 5)) {
      if ((bVar1 & 0x20) != 0) {
        if (sVar20 == 0) {
          return 0;
        }
        sVar13 = 0;
        sVar12 = 0;
        do {
          uVar9 = Reflection::GetRepeatedUInt32(this_01,message,field,(int)sVar13);
          iVar10 = 0x1f;
          if ((uVar9 | 1) != 0) {
            for (; (uVar9 | 1) >> iVar10 == 0; iVar10 = iVar10 + -1) {
            }
          }
          sVar12 = sVar12 + (iVar10 * 9 + 0x49U >> 6);
          sVar13 = sVar13 + 1;
        } while (sVar20 != sVar13);
        return sVar12;
      }
      uVar9 = Reflection::GetUInt32(this_01,message,field);
      iVar10 = 0x1f;
      if ((uVar9 | 1) != 0) {
        for (; (uVar9 | 1) >> iVar10 == 0; iVar10 = iVar10 + -1) {
        }
      }
      goto LAB_00fde42a;
    }
    goto LAB_00fde507;
  case '\x0e':
    bVar1 = field->field_0x1;
    if (0xbf < bVar1 == (bool)((bVar1 & 0x20) >> 5)) {
      if ((bVar1 & 0x20) != 0) {
        if (sVar20 == 0) {
          return 0;
        }
        sVar13 = 0;
        sVar12 = 0;
        do {
          pEVar14 = Reflection::GetRepeatedEnum(this_01,message,field,(int)sVar13);
          uVar17 = (long)pEVar14->number_ | 1;
          lVar4 = 0x3f;
          if (uVar17 != 0) {
            for (; uVar17 >> lVar4 == 0; lVar4 = lVar4 + -1) {
            }
          }
          sVar12 = sVar12 + ((int)lVar4 * 9 + 0x49U >> 6);
          sVar13 = sVar13 + 1;
        } while (sVar20 != sVar13);
        return sVar12;
      }
      pEVar14 = Reflection::GetEnum(this_01,message,field);
      uVar17 = (ulong)pEVar14->number_;
      goto LAB_00fde422;
    }
    goto LAB_00fde540;
  case '\x11':
    bVar1 = field->field_0x1;
    if (0xbf < bVar1 == (bool)((bVar1 & 0x20) >> 5)) {
      if ((bVar1 & 0x20) != 0) {
        if (sVar20 == 0) {
          return 0;
        }
        sVar13 = 0;
        sVar12 = 0;
        do {
          iVar8 = Reflection::GetRepeatedInt32(this_01,message,field,(int)sVar13);
          uVar6 = iVar8 >> 0x1f ^ iVar8 * 2 | 1;
          iVar10 = 0x1f;
          if (uVar6 != 0) {
            for (; uVar6 >> iVar10 == 0; iVar10 = iVar10 + -1) {
            }
          }
          sVar12 = sVar12 + (iVar10 * 9 + 0x49U >> 6);
          sVar13 = sVar13 + 1;
        } while (sVar20 != sVar13);
        return sVar12;
      }
      iVar8 = Reflection::GetInt32(this_01,message,field);
      uVar6 = iVar8 >> 0x1f ^ iVar8 * 2 | 1;
      iVar10 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> iVar10 == 0; iVar10 = iVar10 + -1) {
        }
      }
      goto LAB_00fde42a;
    }
    goto LAB_00fde4f4;
  case '\x12':
    bVar1 = field->field_0x1;
    if (0xbf < bVar1 == (bool)((bVar1 & 0x20) >> 5)) {
      if ((bVar1 & 0x20) != 0) {
        if (sVar20 == 0) {
          return 0;
        }
        sVar13 = 0;
        sVar12 = 0;
        do {
          iVar16 = Reflection::GetRepeatedInt64(this_01,message,field,(int)sVar13);
          uVar17 = iVar16 >> 0x3f ^ iVar16 * 2 | 1;
          lVar4 = 0x3f;
          if (uVar17 != 0) {
            for (; uVar17 >> lVar4 == 0; lVar4 = lVar4 + -1) {
            }
          }
          sVar12 = sVar12 + ((int)lVar4 * 9 + 0x49U >> 6);
          sVar13 = sVar13 + 1;
        } while (sVar20 != sVar13);
        return sVar12;
      }
      iVar16 = Reflection::GetInt64(this_01,message,field);
      uVar17 = iVar16 >> 0x3f ^ iVar16 * 2;
      goto LAB_00fde422;
    }
    goto LAB_00fde579;
  default:
    return 0;
  }
  return sVar20;
}

Assistant:

size_t WireFormat::FieldDataOnlyByteSize(const FieldDescriptor* field,
                                         const Message& message) {
  const Reflection* message_reflection = message.GetReflection();

  size_t data_size = 0;

  if (field->is_map()) {
    const MapFieldBase* map_field =
        message_reflection->GetMapData(message, field);
    if (map_field->IsMapValid()) {
      MapIterator iter(const_cast<Message*>(&message), field);
      MapIterator end(const_cast<Message*>(&message), field);
      const FieldDescriptor* key_field = field->message_type()->field(0);
      const FieldDescriptor* value_field = field->message_type()->field(1);
      for (map_field->MapBegin(&iter), map_field->MapEnd(&end); iter != end;
           ++iter) {
        size_t size = kMapEntryTagByteSize;
        size += MapKeyDataOnlyByteSize(key_field, iter.GetKey());
        size += MapValueRefDataOnlyByteSize(value_field, iter.GetValueRef());
        data_size += WireFormatLite::LengthDelimitedSize(size);
      }
      return data_size;
    }
  }

  size_t count = 0;
  if (field->is_repeated()) {
    count =
        internal::FromIntSize(message_reflection->FieldSize(message, field));
  } else if (field->containing_type()->options().map_entry()) {
    // Map entry fields always need to be serialized.
    count = 1;
  } else if (message_reflection->HasField(message, field)) {
    count = 1;
  }

  switch (field->type()) {
#define HANDLE_TYPE(TYPE, TYPE_METHOD, CPPTYPE_METHOD)                      \
  case FieldDescriptor::TYPE_##TYPE:                                        \
    if (field->is_repeated()) {                                             \
      for (size_t j = 0; j < count; j++) {                                  \
        data_size += WireFormatLite::TYPE_METHOD##Size(                     \
            message_reflection->GetRepeated##CPPTYPE_METHOD(message, field, \
                                                            j));            \
      }                                                                     \
    } else {                                                                \
      data_size += WireFormatLite::TYPE_METHOD##Size(                       \
          message_reflection->Get##CPPTYPE_METHOD(message, field));         \
    }                                                                       \
    break;

#define HANDLE_FIXED_TYPE(TYPE, TYPE_METHOD)                   \
  case FieldDescriptor::TYPE_##TYPE:                           \
    data_size += count * WireFormatLite::k##TYPE_METHOD##Size; \
    break;

    HANDLE_TYPE(INT32, Int32, Int32)
    HANDLE_TYPE(INT64, Int64, Int64)
    HANDLE_TYPE(SINT32, SInt32, Int32)
    HANDLE_TYPE(SINT64, SInt64, Int64)
    HANDLE_TYPE(UINT32, UInt32, UInt32)
    HANDLE_TYPE(UINT64, UInt64, UInt64)

    HANDLE_FIXED_TYPE(FIXED32, Fixed32)
    HANDLE_FIXED_TYPE(FIXED64, Fixed64)
    HANDLE_FIXED_TYPE(SFIXED32, SFixed32)
    HANDLE_FIXED_TYPE(SFIXED64, SFixed64)

    HANDLE_FIXED_TYPE(FLOAT, Float)
    HANDLE_FIXED_TYPE(DOUBLE, Double)

    HANDLE_FIXED_TYPE(BOOL, Bool)

    HANDLE_TYPE(GROUP, Group, Message)

    case FieldDescriptor::TYPE_MESSAGE: {
      if (field->is_repeated()) {
        for (size_t j = 0; j < count; ++j) {
          data_size += WireFormatLite::MessageSize(
              message_reflection->GetRepeatedMessage(message, field, j));
        }
        break;
      }
      if (field->is_extension()) {
        data_size += WireFormatLite::LengthDelimitedSize(
            message_reflection->GetExtensionSet(message).GetMessageByteSizeLong(
                field->number()));
        break;
      }
      data_size += WireFormatLite::MessageSize(
          message_reflection->GetMessage(message, field));
      break;
    }

#undef HANDLE_TYPE
#undef HANDLE_FIXED_TYPE

    case FieldDescriptor::TYPE_ENUM: {
      if (field->is_repeated()) {
        for (size_t j = 0; j < count; j++) {
          data_size += WireFormatLite::EnumSize(
              message_reflection->GetRepeatedEnum(message, field, j)->number());
        }
      } else {
        data_size += WireFormatLite::EnumSize(
            message_reflection->GetEnum(message, field)->number());
      }
      break;
    }

    // Handle strings separately so that we can get string references
    // instead of copying.
    case FieldDescriptor::TYPE_STRING:
    case FieldDescriptor::TYPE_BYTES: {
      if (field->cpp_string_type() == FieldDescriptor::CppStringType::kCord) {
        for (size_t j = 0; j < count; j++) {
          absl::Cord value = message_reflection->GetCord(message, field);
          data_size += WireFormatLite::StringSize(value);
        }
        break;
      }
      for (size_t j = 0; j < count; j++) {
        std::string scratch;
        const std::string& value =
            field->is_repeated()
                ? message_reflection->GetRepeatedStringReference(message, field,
                                                                 j, &scratch)
                : message_reflection->GetStringReference(message, field,
                                                         &scratch);
        data_size += WireFormatLite::StringSize(value);
      }
      break;
    }
  }
  return data_size;
}